

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O1

PrimInfo *
embree::sse2::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,Geometry *geometry,uint geomID,size_t numPrimRefs,
          mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  size_t sVar1;
  PrimInfo *pPVar2;
  char cVar3;
  int iVar4;
  task *ptVar5;
  runtime_error *prVar6;
  size_t *psVar7;
  size_t *psVar8;
  _func_int **pp_Var9;
  _func_int **pp_Var10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  size_t sVar15;
  size_t sVar16;
  size_t taskCount;
  small_object_allocator alloc;
  PrimInfo *pinfo;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  _func_int **local_2970;
  long local_2968;
  long **local_2960;
  task_traits local_2958;
  uint local_294c;
  Geometry *local_2948;
  ulong local_2940;
  BuildProgressMonitor *local_2938;
  mvector<PrimRef> *local_2930;
  size_t local_2928;
  PrimInfo *local_2920;
  long *local_2918;
  ulong *local_2910;
  _func_int ***local_2908;
  undefined1 *local_2900;
  Geometry ***local_28f8;
  Geometry **local_28f0;
  mvector<PrimRef> *local_28e8;
  uint *local_28e0;
  undefined8 local_28d8;
  undefined4 local_28d0;
  wait_context local_28c8;
  task_group_context local_28b8;
  undefined1 local_2838 [5184];
  size_t local_13f8;
  size_t asStack_13f0 [632];
  
  local_294c = geomID;
  local_2948 = geometry;
  local_2938 = progressMonitor;
  local_2928 = numPrimRefs;
  local_2920 = __return_storage_ptr__;
  (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
  local_2940 = (ulong)local_2948->numPrimitives;
  local_2968 = 0;
  local_2930 = prims;
  local_28f0 = &local_2948;
  local_28e8 = prims;
  local_28e0 = &local_294c;
  iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  pp_Var9 = (_func_int **)((local_2940 - local_2968) + 0x3ff >> 10);
  if ((_func_int **)(long)iVar4 < pp_Var9) {
    pp_Var9 = (_func_int **)(long)iVar4;
  }
  pp_Var10 = (_func_int **)0x40;
  if (pp_Var9 < (_func_int **)0x40) {
    pp_Var10 = pp_Var9;
  }
  local_2908 = &local_2970;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2970 = pp_Var10;
  local_2918 = &local_2968;
  local_2910 = &local_2940;
  local_2900 = local_2838;
  local_28f8 = &local_28f0;
  tbb::detail::r1::initialize(&local_28b8);
  local_2960 = &local_2918;
  if (pp_Var9 != (_func_int **)0x0) {
    local_2958.m_version_and_traits = 0;
    ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2958,0xc0);
    ptVar5->m_reserved[3] = 0;
    ptVar5->m_reserved[4] = 0;
    ptVar5->m_reserved[1] = 0;
    ptVar5->m_reserved[2] = 0;
    (ptVar5->super_task_traits).m_version_and_traits = 0;
    ptVar5->m_reserved[0] = 0;
    ptVar5->m_reserved[5] = 0;
    ptVar5->_vptr_task = (_func_int **)&PTR__task_02206dc8;
    ptVar5[1]._vptr_task = pp_Var10;
    ptVar5[1].super_task_traits.m_version_and_traits = 0;
    ptVar5[1].m_reserved[0] = 1;
    ptVar5[1].m_reserved[1] = (uint64_t)&local_2960;
    ptVar5[1].m_reserved[2] = 0;
    ptVar5[1].m_reserved[3] = 1;
    iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar5[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar5[2]._vptr_task + 4) = 5;
    ptVar5[1].m_reserved[5] = ((long)iVar4 & 0x3fffffffffffffffU) * 2;
    ptVar5[2].super_task_traits.m_version_and_traits = local_2958.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar5[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar5,&local_28b8,&local_28c8,&local_28b8);
  }
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  pPVar2 = local_2920;
  if (cVar3 != '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"task cancelled");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  aVar11 = _DAT_01feb9f0;
  (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = _DAT_01feb9f0;
  aVar12 = _DAT_01feba00;
  (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = _DAT_01feba00;
  (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar11;
  (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar12;
  pPVar2->begin = 0;
  pPVar2->end = 0;
  aVar13 = aVar12;
  aVar14 = aVar11;
  if (local_2970 != (_func_int **)0x0) {
    psVar8 = &pPVar2->begin;
    sVar15 = *psVar8;
    sVar16 = pPVar2->end;
    psVar7 = &local_13f8;
    pp_Var9 = local_2970;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -8) = aVar11;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -6) = aVar12;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -4) = aVar14;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar7 + -2) = aVar13;
      sVar1 = pPVar2->end;
      *psVar7 = *psVar8;
      psVar7[1] = sVar1;
      aVar11.m128 = (__m128)minps(aVar11.m128,*(undefined1 (*) [16])(psVar7 + -0x288));
      aVar12.m128 = (__m128)maxps(aVar12.m128,*(undefined1 (*) [16])(psVar7 + -0x286));
      aVar14.m128 = (__m128)minps(aVar14.m128,*(undefined1 (*) [16])(psVar7 + -0x284));
      aVar13.m128 = (__m128)maxps(aVar13.m128,*(undefined1 (*) [16])(psVar7 + -0x282));
      sVar15 = sVar15 + psVar7[-0x280];
      sVar16 = sVar16 + psVar7[-0x27f];
      *psVar8 = sVar15;
      pPVar2->end = sVar16;
      psVar7 = psVar7 + 10;
      pp_Var9 = (_func_int **)((long)pp_Var9 + -1);
    } while (pp_Var9 != (_func_int **)0x0);
  }
  (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar11;
  (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar12;
  (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar14;
  (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar13;
  if (pPVar2->end - pPVar2->begin != local_2928) {
    (**local_2938->_vptr_BuildProgressMonitor)(local_2938,0);
    local_2940 = (ulong)local_2948->numPrimitives;
    local_28f0 = &local_2948;
    local_28e8 = local_2930;
    local_28e0 = &local_294c;
    local_2968 = 0;
    iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    pp_Var9 = (_func_int **)((local_2940 - local_2968) + 0x3ff >> 10);
    if ((_func_int **)(long)iVar4 < pp_Var9) {
      pp_Var9 = (_func_int **)(long)iVar4;
    }
    pp_Var10 = (_func_int **)0x40;
    if (pp_Var9 < (_func_int **)0x40) {
      pp_Var10 = pp_Var9;
    }
    local_2918 = &local_2968;
    local_2908 = &local_2970;
    local_28b8.my_version = proxy_support;
    local_28b8.my_traits = (context_traits)0x4;
    local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_28b8.my_name = CUSTOM_CTX;
    local_2970 = pp_Var10;
    local_2910 = &local_2940;
    local_2900 = local_2838;
    local_28f8 = &local_28f0;
    tbb::detail::r1::initialize(&local_28b8);
    local_2960 = &local_2918;
    if (pp_Var9 != (_func_int **)0x0) {
      local_2958.m_version_and_traits = 0;
      ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2958,0xc0);
      ptVar5->m_reserved[3] = 0;
      ptVar5->m_reserved[4] = 0;
      ptVar5->m_reserved[1] = 0;
      ptVar5->m_reserved[2] = 0;
      (ptVar5->super_task_traits).m_version_and_traits = 0;
      ptVar5->m_reserved[0] = 0;
      ptVar5->m_reserved[5] = 0;
      ptVar5->_vptr_task = (_func_int **)&PTR__task_02206e10;
      ptVar5[1]._vptr_task = pp_Var10;
      ptVar5[1].super_task_traits.m_version_and_traits = 0;
      ptVar5[1].m_reserved[0] = 1;
      ptVar5[1].m_reserved[1] = (uint64_t)&local_2960;
      ptVar5[1].m_reserved[2] = 0;
      ptVar5[1].m_reserved[3] = 1;
      iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar5[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar5[2]._vptr_task + 4) = 5;
      ptVar5[1].m_reserved[5] = ((long)iVar4 & 0x3fffffffffffffffU) * 2;
      ptVar5[2].super_task_traits.m_version_and_traits = local_2958.m_version_and_traits;
      local_28d8 = 0;
      local_28d0 = 1;
      local_28c8.m_version_and_traits = 1;
      local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar5[1].m_reserved[4] = (uint64_t)&local_28d8;
      tbb::detail::r1::execute_and_wait(ptVar5,&local_28b8,&local_28c8,&local_28b8);
    }
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
    if (cVar3 != '\0') {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"task cancelled");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_28b8);
    aVar11 = _DAT_01feb9f0;
    aVar12 = _DAT_01feba00;
    aVar13 = _DAT_01feba00;
    aVar14 = _DAT_01feb9f0;
    if (local_2970 == (_func_int **)0x0) {
      sVar15 = 0;
      sVar16 = 0;
    }
    else {
      psVar8 = asStack_13f0;
      sVar16 = 0;
      sVar15 = 0;
      do {
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar8 + -9) = aVar14;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar8 + -7) = aVar13;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar8 + -5) = aVar11;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar8 + -3) = aVar12;
        psVar8[-1] = sVar15;
        *psVar8 = sVar16;
        aVar14.m128 = (__m128)minps(aVar14.m128,*(undefined1 (*) [16])(psVar8 + -0x289));
        aVar13.m128 = (__m128)maxps(aVar13.m128,*(undefined1 (*) [16])(psVar8 + -0x287));
        aVar11.m128 = (__m128)minps(aVar11.m128,*(undefined1 (*) [16])(psVar8 + -0x285));
        aVar12.m128 = (__m128)maxps(aVar12.m128,*(undefined1 (*) [16])(psVar8 + -0x283));
        sVar15 = sVar15 + psVar8[-0x281];
        sVar16 = sVar16 + psVar8[-0x280];
        psVar8 = psVar8 + 10;
        local_2970 = (_func_int **)((long)local_2970 + -1);
      } while (local_2970 != (_func_int **)0x0);
    }
    (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar14;
    (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar13;
    (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar11;
    (pPVar2->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar12;
    pPVar2->begin = sVar15;
    pPVar2->end = sVar16;
  }
  return pPVar2;
}

Assistant:

PrimInfo createPrimRefArray(Geometry* geometry, unsigned int geomID, const size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelPrefixSumState<PrimInfo> pstate;
      
      /* first try */
      progressMonitor(0);
      PrimInfo pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
          return geometry->createPrimRefArray(prims,r,r.begin(),geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
          return geometry->createPrimRefArray(prims,r,base.size(),geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      }
      return pinfo;
    }